

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_object.cxx
# Opt level: O0

bool __thiscall xray_re::xr_object::save_bones(xr_object *this,char *path)

{
  bool bVar1;
  xr_memory_writer *this_00;
  bool status;
  xr_memory_writer *w;
  char *path_local;
  xr_object *this_local;
  
  this_00 = (xr_memory_writer *)operator_new(0x2078);
  xr_memory_writer::xr_memory_writer(this_00);
  (*(this->super_xr_surface_factory)._vptr_xr_surface_factory[0xf])(this,this_00);
  bVar1 = xr_memory_writer::save_to(this_00,path);
  if (this_00 != (xr_memory_writer *)0x0) {
    (*(this_00->super_xr_writer)._vptr_xr_writer[1])();
  }
  return bVar1;
}

Assistant:

bool xr_object::save_bones(const char* path) const
{
	xr_memory_writer* w = new xr_memory_writer();
	save_bones(*w);
	bool status = w->save_to(path);
	delete w;
	return status;
}